

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::make_huff_table(jpeg_decoder *this,int index,huff_tables *pH)

{
  byte bVar1;
  byte bVar2;
  uint8 *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint8 huffsize [258];
  uint huffcode [258];
  byte local_548 [272];
  uint local_438 [258];
  
  pH->ac_table = this->m_huff_ac[index] != '\0';
  puVar3 = this->m_huff_num[index];
  uVar16 = 0;
  lVar8 = 1;
  do {
    bVar1 = puVar3[lVar8];
    if (bVar1 != 0) {
      uVar9 = 0x101;
      if (0x101 < (int)uVar16) {
        uVar9 = (ulong)uVar16;
      }
      lVar11 = 0;
      do {
        if (uVar9 - (long)(int)uVar16 == lVar11) goto LAB_001d9533;
        local_548[lVar11 + (int)uVar16] = (byte)lVar8;
        lVar11 = lVar11 + 1;
      } while ((uint)bVar1 != (uint)lVar11);
      uVar16 = uVar16 + (uint)lVar11;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  if (0x101 < (int)uVar16) {
    __assert_fail("p < 258",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                  ,0x8c6,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
  }
  local_548[(int)uVar16] = 0;
  uVar5 = (uint)local_548[0];
  if (local_548[0] != 0) {
    uVar6 = 0;
    iVar10 = 0;
    do {
      if (uVar5 == local_548[0]) {
        lVar8 = (long)(int)uVar6;
        uVar9 = 0x101;
        if (0x101 < (int)uVar6) {
          uVar9 = (ulong)uVar6;
        }
        lVar11 = lVar8 << 0x20;
        lVar14 = 0;
        do {
          if (uVar9 - lVar8 == lVar14) goto LAB_001d9533;
          local_438[lVar8 + lVar14] = iVar10 + (int)lVar14;
          lVar4 = lVar14 + lVar8;
          lVar14 = lVar14 + 1;
          lVar11 = lVar11 + 0x100000000;
        } while (uVar5 == local_548[lVar4 + 1]);
        uVar6 = uVar6 + (int)lVar14;
        local_548[0] = local_548[lVar11 >> 0x20];
        iVar10 = iVar10 + (int)lVar14;
      }
      iVar10 = iVar10 * 2;
      uVar5 = uVar5 + 1;
    } while (local_548[0] != 0);
  }
  memset(pH->look_up,0,0x1100);
  if (0 < (int)uVar16) {
    uVar12 = 0xffffffff;
    uVar9 = 0;
    do {
      bVar1 = this->m_huff_val[index][uVar9];
      uVar5 = local_438[uVar9];
      bVar2 = local_548[uVar9];
      pH->code_size[bVar1] = bVar2;
      uVar6 = (uint)bVar2;
      if (uVar6 < 9) {
        uVar5 = uVar5 << (8 - bVar2 & 0x1f);
        uVar15 = (ulong)uVar5;
        uVar6 = (bVar1 & 0xf) + (uint)bVar2;
        if (uVar5 < 0x101) {
          uVar5 = 0x100;
        }
        iVar10 = (1 << (8 - bVar2 & 0x1f)) + 1;
        do {
          if (uVar5 == uVar15) goto LAB_001d9533;
          pH->look_up[uVar15] = (uint)bVar1;
          uVar7 = (uint)CONCAT11(bVar2,bVar1);
          if (uVar6 < 9 && (bVar1 & 0xf) != 0) {
            uVar7 = (uint)bVar1 +
                    (((uint)uVar15 >> (8U - (char)uVar6 & 0x1f) & ~(-1 << (sbyte)(bVar1 & 0xf))) <<
                     0x10 | uVar6 * 0x100) + 0x8000;
          }
          pH->look_up2[uVar15] = uVar7;
          uVar15 = uVar15 + 1;
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
      }
      else {
        uVar7 = uVar5 >> (bVar2 - 8 & 0x1f) & 0xff;
        uVar13 = pH->look_up[uVar7];
        if (uVar13 == 0) {
          pH->look_up[uVar7] = uVar12;
          pH->look_up2[uVar7] = uVar12;
          uVar13 = uVar12;
          uVar12 = uVar12 - 2;
        }
        uVar5 = uVar5 << (0x18 - bVar2 & 0x1f);
        if (uVar6 != 9) {
          iVar10 = uVar6 + 1;
          do {
            uVar6 = (uVar13 - 1) + (uint)((uVar5 >> 0xf & 1) != 0);
            if (uVar6 < 0xfffffe00) goto LAB_001d9533;
            uVar6 = ~uVar6;
            uVar13 = pH->tree[uVar6];
            if (uVar13 == 0) {
              pH->tree[uVar6] = uVar12;
              uVar13 = uVar12;
              uVar12 = uVar12 - 2;
            }
            uVar5 = uVar5 * 2;
            iVar10 = iVar10 + -1;
          } while (10 < iVar10);
        }
        uVar5 = (uVar13 - 1) + (uint)((uVar5 >> 0xf & 1) != 0);
        if ((int)uVar5 < -0x200) {
LAB_001d9533:
          stop_decoding(this,JPGD_DECODE_ERROR);
        }
        pH->tree[(int)~uVar5] = (uint)bVar1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar16);
  }
  return;
}

Assistant:

void jpeg_decoder::make_huff_table(int index, huff_tables* pH)
	{
		int p, i, l, si;
		uint8 huffsize[258];
		uint huffcode[258];
		uint code;
		uint subtree;
		int code_size;
		int lastp;
		int nextfreeentry;
		int currententry;

		pH->ac_table = m_huff_ac[index] != 0;

		p = 0;

		for (l = 1; l <= 16; l++)
		{
			for (i = 1; i <= m_huff_num[index][l]; i++)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffsize[p++] = static_cast<uint8>(l);
			}
		}

		assert(p < 258);
		huffsize[p] = 0;

		lastp = p;

		code = 0;
		si = huffsize[0];
		p = 0;

		while (huffsize[p])
		{
			while (huffsize[p] == si)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffcode[p++] = code;
				code++;
			}

			code <<= 1;
			si++;
		}

		memset(pH->look_up, 0, sizeof(pH->look_up));
		memset(pH->look_up2, 0, sizeof(pH->look_up2));
		memset(pH->tree, 0, sizeof(pH->tree));
		memset(pH->code_size, 0, sizeof(pH->code_size));

		nextfreeentry = -1;

		p = 0;

		while (p < lastp)
		{
			i = m_huff_val[index][p];

			code = huffcode[p];
			code_size = huffsize[p];

			assert(i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			pH->code_size[i] = static_cast<uint8>(code_size);

			if (code_size <= 8)
			{
				code <<= (8 - code_size);

				for (l = 1 << (8 - code_size); l > 0; l--)
				{
					if (code >= 256)
						stop_decoding(JPGD_DECODE_ERROR);

					pH->look_up[code] = i;

					bool has_extrabits = false;
					int extra_bits = 0;
					int num_extra_bits = i & 15;

					int bits_to_fetch = code_size;
					if (num_extra_bits)
					{
						int total_codesize = code_size + num_extra_bits;
						if (total_codesize <= 8)
						{
							has_extrabits = true;
							extra_bits = ((1 << num_extra_bits) - 1) & (code >> (8 - total_codesize));

							if (extra_bits > 0x7FFF)
								stop_decoding(JPGD_DECODE_ERROR);

							bits_to_fetch += num_extra_bits;
						}
					}

					if (!has_extrabits)
						pH->look_up2[code] = i | (bits_to_fetch << 8);
					else
						pH->look_up2[code] = i | 0x8000 | (extra_bits << 16) | (bits_to_fetch << 8);

					code++;
				}
			}
			else
			{
				subtree = (code >> (code_size - 8)) & 0xFF;

				currententry = pH->look_up[subtree];

				if (currententry == 0)
				{
					pH->look_up[subtree] = currententry = nextfreeentry;
					pH->look_up2[subtree] = currententry = nextfreeentry;

					nextfreeentry -= 2;
				}

				code <<= (16 - (code_size - 8));

				for (l = code_size; l > 9; l--)
				{
					if ((code & 0x8000) == 0)
						currententry--;

					unsigned int idx = -currententry - 1;

					if (idx >= JPGD_HUFF_TREE_MAX_LENGTH)
						stop_decoding(JPGD_DECODE_ERROR);

					if (pH->tree[idx] == 0)
					{
						pH->tree[idx] = nextfreeentry;

						currententry = nextfreeentry;

						nextfreeentry -= 2;
					}
					else
					{
						currententry = pH->tree[idx];
					}

					code <<= 1;
				}

				if ((code & 0x8000) == 0)
					currententry--;

				if ((-currententry - 1) >= JPGD_HUFF_TREE_MAX_LENGTH)
					stop_decoding(JPGD_DECODE_ERROR);

				pH->tree[-currententry - 1] = i;
			}

			p++;
		}
	}